

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestComparisons_Test::TestBody(PossibleContentsTest_TestComparisons_Test *this)

{
  PossibleContentsTest_TestComparisons_Test *this_local;
  
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).none);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).i32Zero);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).i32Global1
            );
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).exactI32);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).none,&(this->super_PossibleContentsTest).many);
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).i32Zero
            );
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).i32One)
  ;
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).f64One)
  ;
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).i32Global1);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,
             &(this->super_PossibleContentsTest).exactI32);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).many);
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).i32Global1);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).i32Global2);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,
             &(this->super_PossibleContentsTest).exactI32);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Global1,&(this->super_PossibleContentsTest).many
            );
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactI32);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,
             &(this->super_PossibleContentsTest).exactAnyref);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactI32,&(this->super_PossibleContentsTest).many);
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).many,&(this->super_PossibleContentsTest).many);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).i32Zero,&(this->super_PossibleContentsTest).anyNull
            );
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,
             &(this->super_PossibleContentsTest).funcNull);
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).anyNull,&(this->super_PossibleContentsTest).anyNull
            );
  assertEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactNonNullAnyref,
             &(this->super_PossibleContentsTest).exactNonNullAnyref);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (&(this->super_PossibleContentsTest).exactNonNullAnyref,
             &(this->super_PossibleContentsTest).exactAnyref);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestComparisons) {
  assertEqualSymmetric(none, none);
  assertNotEqualSymmetric(none, i32Zero);
  assertNotEqualSymmetric(none, i32Global1);
  assertNotEqualSymmetric(none, exactI32);
  assertNotEqualSymmetric(none, many);

  assertEqualSymmetric(i32Zero, i32Zero);
  assertNotEqualSymmetric(i32Zero, i32One);
  assertNotEqualSymmetric(i32Zero, f64One);
  assertNotEqualSymmetric(i32Zero, i32Global1);
  assertNotEqualSymmetric(i32Zero, exactI32);
  assertNotEqualSymmetric(i32Zero, many);

  assertEqualSymmetric(i32Global1, i32Global1);
  assertNotEqualSymmetric(i32Global1, i32Global2);
  assertNotEqualSymmetric(i32Global1, exactI32);
  assertNotEqualSymmetric(i32Global1, many);

  assertEqualSymmetric(exactI32, exactI32);
  assertNotEqualSymmetric(exactI32, exactAnyref);
  assertNotEqualSymmetric(exactI32, many);

  assertEqualSymmetric(many, many);

  // Nulls

  assertNotEqualSymmetric(i32Zero, anyNull);
  assertNotEqualSymmetric(anyNull, funcNull);
  assertEqualSymmetric(anyNull, anyNull);

  assertEqualSymmetric(exactNonNullAnyref, exactNonNullAnyref);
  assertNotEqualSymmetric(exactNonNullAnyref, exactAnyref);
}